

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O3

void __thiscall bgui::BaseWindow::getContent(BaseWindow *this,ImageU8 *image)

{
  int iVar1;
  XImage *pXVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  BaseWindowData *pBVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  
  pXVar2 = this->p->image;
  uVar14 = 0xfffffffe;
  do {
    uVar4 = uVar14 + 2;
    uVar14 = uVar14 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar2->red_mask) == 0);
  do {
    uVar14 = uVar14 + 1;
    if (0x1f < uVar14) break;
  } while (((long)(1 << ((byte)uVar14 & 0x1f)) & pXVar2->red_mask) != 0);
  if (0x1f < uVar14) {
    uVar14 = 0;
  }
  bVar7 = (char)uVar14 - 8;
  if (uVar14 < 8) {
    bVar7 = 0;
  }
  uVar4 = 0xfffffffe;
  do {
    uVar5 = uVar4 + 2;
    uVar4 = uVar4 + 1;
    if (0x1f < uVar5) break;
  } while (((long)(1 << ((byte)uVar5 & 0x1f)) & pXVar2->green_mask) == 0);
  do {
    uVar4 = uVar4 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar2->green_mask) != 0);
  if (0x1f < uVar4) {
    uVar4 = 0;
  }
  bVar8 = (char)uVar4 - 8;
  if (uVar4 < 8) {
    bVar8 = 0;
  }
  uVar5 = 0xfffffffe;
  do {
    uVar6 = uVar5 + 2;
    uVar5 = uVar5 + 1;
    if (0x1f < uVar6) break;
  } while (((long)(1 << ((byte)uVar6 & 0x1f)) & pXVar2->blue_mask) == 0);
  do {
    uVar5 = uVar5 + 1;
    if (0x1f < uVar5) break;
  } while (((long)(1 << ((byte)uVar5 & 0x1f)) & pXVar2->blue_mask) != 0);
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (image,(long)this->p->w,(long)this->p->h,3);
  pBVar10 = this->p;
  if (0 < pBVar10->h) {
    uVar11 = 0;
    if (0x1f < uVar5) {
      uVar5 = 0;
    }
    uVar6 = uVar5 - 8;
    if (uVar5 < 8) {
      uVar6 = 0;
    }
    uVar9 = (ulong)-(uVar5 - 8);
    if (7 < uVar5) {
      uVar9 = uVar11;
    }
    uVar16 = (ulong)(8 - uVar4);
    if (7 < uVar4) {
      uVar16 = uVar11;
    }
    uVar15 = (ulong)(8 - uVar14);
    if (7 < uVar14) {
      uVar15 = uVar11;
    }
    do {
      if (0 < pBVar10->w) {
        iVar12 = pBVar10->image->bytes_per_line * (int)uVar11;
        pcVar3 = pBVar10->image->data;
        lVar13 = 0;
        do {
          iVar1 = pBVar10->image->bitmap_unit;
          if (iVar1 == 0x20) {
            uVar14 = *(uint *)(pcVar3 + lVar13 * 4 + (long)iVar12);
          }
          else if (iVar1 == 0x10) {
            uVar14 = (uint)*(ushort *)(pcVar3 + lVar13 * 2 + (long)iVar12);
          }
          else {
            uVar14 = 0;
            if (iVar1 == 8) {
              uVar14 = (uint)(byte)pcVar3[lVar13 + iVar12];
            }
          }
          (*image->img)[uVar11][lVar13] =
               (uchar)(((ulong)((uint)pBVar10->image->red_mask & uVar14) << ((byte)uVar15 & 0x3f))
                      >> (bVar7 & 0x3f));
          image->img[1][uVar11][lVar13] =
               (uchar)(((ulong)((uint)this->p->image->green_mask & uVar14) << ((byte)uVar16 & 0x3f))
                      >> (bVar8 & 0x3f));
          image->img[2][uVar11][lVar13] =
               (uchar)(((ulong)(uVar14 & (uint)this->p->image->blue_mask) << ((byte)uVar9 & 0x3f))
                      >> ((byte)uVar6 & 0x3f));
          lVar13 = lVar13 + 1;
          pBVar10 = this->p;
        } while (lVar13 < pBVar10->w);
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)pBVar10->h);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pBVar10->mutex);
  return;
}

Assistant:

void BaseWindow::getContent(gimage::ImageU8 &image)
{
  int rls, rrs;
  int gls, grs;
  int bls, brs;

  // store image in buffer

  getShiftFromMask(p->image->red_mask, rls, rrs);
  getShiftFromMask(p->image->green_mask, gls, grs);
  getShiftFromMask(p->image->blue_mask, bls, brs);

  pthread_mutex_lock(&(p->mutex));

  image.setSize(p->w, p->h, 3);

  for (int k=0; k<p->h; k++)
  {
    char *line=p->image->data+k*p->image->bytes_per_line;

    for (int i=0; i<p->w; i++)
    {
      uint32_t v=0;

      switch (p->image->bitmap_unit)
      {
        case 8:
          v=reinterpret_cast<uint8_t *>(line)[i];
          break;

        case 16:
          v=reinterpret_cast<uint16_t *>(line)[i];
          break;

        case 32:
          v=reinterpret_cast<uint32_t *>(line)[i];
          break;
      }

      image.set(i, k, 0, inverseShiftAndMaskValue(v, rls, rrs, p->image->red_mask));
      image.set(i, k, 1, inverseShiftAndMaskValue(v, gls, grs, p->image->green_mask));
      image.set(i, k, 2, inverseShiftAndMaskValue(v, bls, brs, p->image->blue_mask));
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}